

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::AssertionResult::AssertionResult(AssertionResult *this,AssertionResult *param_1)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  bool bVar5;
  
  (this->m_info).macroName._M_dataplus._M_p = (pointer)&(this->m_info).macroName.field_2;
  pcVar1 = (param_1->m_info).macroName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->m_info).macroName._M_string_length);
  uVar2 = *(undefined4 *)((long)&(param_1->m_info).lineInfo.file + 4);
  sVar4 = (param_1->m_info).lineInfo.line;
  uVar3 = *(undefined4 *)((long)&(param_1->m_info).lineInfo.line + 4);
  *(undefined4 *)&(this->m_info).lineInfo.file = *(undefined4 *)&(param_1->m_info).lineInfo.file;
  *(undefined4 *)((long)&(this->m_info).lineInfo.file + 4) = uVar2;
  *(int *)&(this->m_info).lineInfo.line = (int)sVar4;
  *(undefined4 *)((long)&(this->m_info).lineInfo.line + 4) = uVar3;
  (this->m_info).capturedExpression._M_dataplus._M_p =
       (pointer)&(this->m_info).capturedExpression.field_2;
  pcVar1 = (param_1->m_info).capturedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).capturedExpression,pcVar1,
             pcVar1 + (param_1->m_info).capturedExpression._M_string_length);
  (this->m_info).resultDisposition = (param_1->m_info).resultDisposition;
  (this->m_resultData).decomposedExpression = (param_1->m_resultData).decomposedExpression;
  (this->m_resultData).reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->m_resultData).reconstructedExpression.field_2;
  pcVar1 = (param_1->m_resultData).reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_resultData).reconstructedExpression,pcVar1,
             pcVar1 + (param_1->m_resultData).reconstructedExpression._M_string_length);
  (this->m_resultData).message._M_dataplus._M_p = (pointer)&(this->m_resultData).message.field_2;
  pcVar1 = (param_1->m_resultData).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_resultData).message,pcVar1,
             pcVar1 + (param_1->m_resultData).message._M_string_length);
  bVar5 = (param_1->m_resultData).parenthesized;
  (this->m_resultData).negated = (param_1->m_resultData).negated;
  (this->m_resultData).parenthesized = bVar5;
  (this->m_resultData).resultType = (param_1->m_resultData).resultType;
  return;
}

Assistant:

AssertionResult( AssertionResult const& )              = default;